

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.h
# Opt level: O0

void __thiscall
pstack::Procman::MappedObject::MappedObject(MappedObject *this,string_view name,sptr *objptr)

{
  allocator<char> local_29;
  sptr *local_28;
  sptr *objptr_local;
  MappedObject *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (MappedObject *)name._M_len;
  local_28 = objptr;
  objptr_local = (sptr *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_29);
  std::allocator<char>::~allocator(&local_29);
  std::shared_ptr<pstack::Elf::Object>::shared_ptr(&this->objptr_,local_28);
  return;
}

Assistant:

MappedObject(std::string_view name, const Elf::Object::sptr &objptr = {})
        : name_{name}, objptr_{objptr} {}